

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::addPageContents(QPDFObjectHandle *this,QPDFObjectHandle *new_contents,bool first)

{
  bool bVar1;
  QPDFObjectHandle local_b8;
  allocator<char> local_a1;
  string local_a0;
  value_type *local_80;
  QPDFObjectHandle *iter;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  undefined1 local_38 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> content_streams;
  bool first_local;
  QPDFObjectHandle *new_contents_local;
  QPDFObjectHandle *this_local;
  
  content_streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = first;
  assertStream(new_contents);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_38);
  if ((content_streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    QTC::TC("qpdf","QPDFObjectHandle prepend page contents",0);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_38,new_contents)
    ;
  }
  getPageContents((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1,this);
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  iter = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                   ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&iter);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&__end1);
    QTC::TC("qpdf","QPDFObjectHandle append page contents",0);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_38,local_80);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  if ((content_streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_38,new_contents)
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"/Contents",&local_a1);
  newArray(&local_b8,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_38);
  replaceKey(this,&local_a0,&local_b8);
  ~QPDFObjectHandle(&local_b8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::addPageContents(QPDFObjectHandle new_contents, bool first)
{
    new_contents.assertStream();

    std::vector<QPDFObjectHandle> content_streams;
    if (first) {
        QTC::TC("qpdf", "QPDFObjectHandle prepend page contents");
        content_streams.push_back(new_contents);
    }
    for (auto const& iter: getPageContents()) {
        QTC::TC("qpdf", "QPDFObjectHandle append page contents");
        content_streams.push_back(iter);
    }
    if (!first) {
        content_streams.push_back(new_contents);
    }

    this->replaceKey("/Contents", newArray(content_streams));
}